

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

EStatusCode __thiscall CFFFileInput::ReadPrivateDicts(CFFFileInput *this,unsigned_short inFontIndex)

{
  EStatusCode EVar1;
  ulong *puVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)this->mFontsCount;
  lVar4 = uVar5 * 0x48;
  puVar2 = (ulong *)operator_new__(lVar4 + 8);
  *puVar2 = uVar5;
  if (uVar5 != 0) {
    puVar3 = puVar2 + 4;
    do {
      *(undefined4 *)puVar3 = 0;
      puVar3[1] = 0;
      puVar3[2] = (ulong)puVar3;
      puVar3[3] = (ulong)puVar3;
      puVar3[-3] = 0;
      puVar3[-2] = 0;
      puVar3[4] = 0;
      puVar3[5] = 0;
      puVar3 = puVar3 + 9;
      lVar4 = lVar4 + -0x48;
    } while (lVar4 != 0);
  }
  this->mPrivateDicts = (PrivateDictInfo *)(puVar2 + 1);
  EVar1 = ReadPrivateDict(this,&this->mTopDictIndex[inFontIndex].mTopDict,
                          (PrivateDictInfo *)(puVar2 + 1) + inFontIndex);
  if (EVar1 != eSuccess) {
    return EVar1;
  }
  EVar1 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  return EVar1;
}

Assistant:

EStatusCode CFFFileInput::ReadPrivateDicts(unsigned short inFontIndex)
{
	// allocate all (to maintain indexing...whatever), but read just the relevant font dict
	mPrivateDicts = new PrivateDictInfo[mFontsCount];
	EStatusCode status = ReadPrivateDict(mTopDictIndex[inFontIndex].mTopDict,mPrivateDicts + inFontIndex);

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();	
}